

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
consistentProperty(pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *__return_storage_ptr__,string *lhs,string *rhs,CompatibleType t)

{
  __type _Var1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  char *rhs_00;
  string_view sVar5;
  pair<bool,_const_char_*> pVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  bool local_ba;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  bool local_98 [8];
  pair<bool,_const_char_*> value;
  bool local_63;
  bool local_62;
  bool local_61 [6];
  bool same;
  bool local_49;
  undefined1 local_48 [8];
  string null_ptr;
  CompatibleType t_local;
  string *rhs_local;
  string *lhs_local;
  
  null_ptr.field_2._12_4_ = t;
  valueAsString<decltype(nullptr)>((string *)local_48,(nullptr_t)0x0);
  _Var1 = std::operator==(lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48);
  if ((_Var1) &&
     (_Var1 = std::operator==(rhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48), _Var1)) {
    local_49 = true;
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    pair<bool,_true>(__return_storage_ptr__,&local_49,lhs);
  }
  else {
    _Var1 = std::operator==(lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48);
    if (_Var1) {
      local_61[0] = true;
      std::
      pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair<bool,_true>(__return_storage_ptr__,local_61,rhs);
    }
    else {
      _Var1 = std::operator==(rhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48);
      if (_Var1) {
        local_62 = true;
        std::
        pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<bool,_true>(__return_storage_ptr__,&local_62,lhs);
      }
      else if (null_ptr.field_2._12_4_ == 0) {
        sVar5 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)lhs)
        ;
        bVar2 = cmIsOn(sVar5);
        sVar5 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)rhs)
        ;
        value.second = (char *)sVar5._M_len;
        bVar3 = cmIsOn(sVar5);
        local_63 = bVar2 == bVar3;
        local_e0 = lhs;
        if (!local_63) {
          local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
        }
        std::
        pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<bool_&,_true>(__return_storage_ptr__,&local_63,local_e0);
      }
      else if (null_ptr.field_2._12_4_ == 1) {
        consistentStringProperty(__return_storage_ptr__,lhs,rhs);
      }
      else {
        if (1 < null_ptr.field_2._12_4_ - 2) {
          __assert_fail("false && \"Unreachable!\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                        ,0x17e3,
                        "std::pair<bool, std::string> consistentProperty(const std::string &, const std::string &, CompatibleType)"
                       );
        }
        pcVar4 = (char *)std::__cxx11::string::c_str();
        rhs_00 = (char *)std::__cxx11::string::c_str();
        pVar6 = consistentNumberProperty(pcVar4,rhs_00,null_ptr.field_2._12_4_);
        pcVar4 = pVar6.second;
        local_98[0] = pVar6.first;
        local_ba = ((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
        value._0_8_ = pcVar4;
        if (local_ba) {
          std::__cxx11::string::string((string *)&local_b8,(string *)local_48);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar4,&local_b9);
        }
        local_ba = !local_ba;
        std::
        pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<bool_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (__return_storage_ptr__,local_98,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        if (local_ba) {
          std::allocator<char>::~allocator(&local_b9);
        }
      }
    }
  }
  local_61[1] = true;
  local_61[2] = false;
  local_61[3] = false;
  local_61[4] = false;
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static std::pair<bool, std::string> consistentProperty(const std::string& lhs,
                                                       const std::string& rhs,
                                                       CompatibleType t)
{
  const std::string null_ptr = valueAsString(nullptr);

  if (lhs == null_ptr && rhs == null_ptr) {
    return { true, lhs };
  }
  if (lhs == null_ptr) {
    return { true, rhs };
  }
  if (rhs == null_ptr) {
    return { true, lhs };
  }

  switch (t) {
    case BoolType: {
      bool same = cmIsOn(lhs) == cmIsOn(rhs);
      return { same, same ? lhs : null_ptr };
    }
    case StringType:
      return consistentStringProperty(lhs, rhs);
    case NumberMinType:
    case NumberMaxType: {
      auto value = consistentNumberProperty(lhs.c_str(), rhs.c_str(), t);
      return { value.first,
               value.first ? std::string(value.second) : null_ptr };
    }
  }
  assert(false && "Unreachable!");
  return { false, null_ptr };
}